

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O0

Type convertToExtendedType(QCborContainerPrivate *d)

{
  long lVar1;
  double dVar2;
  Element e_00;
  char cVar3;
  enable_if_t<std::is_unsigned_v<long_long>____std::is_signed_v<long_long>,_bool> eVar4;
  bool bVar5;
  QFlags<QtCbor::Element::ValueFlag> QVar6;
  const_reference pEVar7;
  reference pEVar8;
  ByteData *this;
  char *__src;
  unsigned_long *puVar9;
  long in_FS_OFFSET;
  QLatin1StringView QVar10;
  bool ok;
  ByteData *b;
  Element *e;
  qint64 tag;
  QByteArray encoded;
  QUrl url;
  QByteArray text;
  qint64 msecs;
  QDateTime dt;
  anon_class_16_2_94731e6a replaceByteData;
  char buf [16];
  undefined4 in_stack_fffffffffffffdb8;
  Initialization in_stack_fffffffffffffdbc;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  anon_class_16_2_94731e6a *in_stack_fffffffffffffdc8;
  anon_class_16_2_94731e6a *paVar11;
  QString *in_stack_fffffffffffffdd0;
  QString *in_stack_fffffffffffffdd8;
  QFlagsStorage<QtCbor::Element::ValueFlag> QVar12;
  QTimeZone *in_stack_fffffffffffffde0;
  QByteArray *pQVar13;
  QCborContainerPrivate *in_stack_fffffffffffffde8;
  undefined8 in_stack_fffffffffffffdf0;
  undefined7 in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffdff;
  anon_union_8_2_4ee71171_for_Element_0 in_stack_fffffffffffffe00;
  undefined8 in_stack_fffffffffffffe08;
  enable_if_t<std::is_integral_v<long_long>,_bool> local_18d;
  undefined8 in_stack_fffffffffffffe88;
  DateFormat format;
  QDateTime *in_stack_fffffffffffffe90;
  Type local_140;
  undefined1 local_13c [4];
  unsigned_long local_138 [2];
  undefined4 local_128;
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> local_124 [7];
  QByteArray local_108;
  QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4> local_ec;
  FormattingOptions in_stack_ffffffffffffff2c;
  QByteArray local_a8;
  undefined1 *local_80 [5];
  CompareAgainstLiteralZero local_51;
  undefined1 *local_50;
  undefined1 *local_48;
  reference pEStack_40;
  anon_union_8_2_4ee71171_for_Element_0 local_38;
  undefined8 uStack_30;
  undefined1 local_20 [8];
  anon_class_16_2_94731e6a local_18;
  long local_8;
  
  format = (DateFormat)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pEVar7 = QList<QtCbor::Element>::at
                     ((QList<QtCbor::Element> *)
                      CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                      CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  lVar1 = (pEVar7->field_0).value;
  pEVar8 = QList<QtCbor::Element>::operator[]
                     ((QList<QtCbor::Element> *)
                      CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                      CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  local_38 = pEVar8->field_0;
  uStack_30._0_4_ = pEVar8->type;
  uStack_30._4_4_ = pEVar8->flags;
  e_00.type = (int)in_stack_fffffffffffffe08;
  e_00.flags.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
  super_QFlagsStorage<QtCbor::Element::ValueFlag>.i =
       (QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>)
       (QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>)
       (int)((ulong)in_stack_fffffffffffffe08 >> 0x20);
  e_00.field_0.value = in_stack_fffffffffffffe00.value;
  this = QCborContainerPrivate::byteData(in_stack_fffffffffffffde8,e_00);
  local_48 = local_20;
  pEStack_40 = pEVar8;
  switch(lVar1) {
  case 0:
  case 1:
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    QDateTime::QDateTime((QDateTime *)0x46f226);
    if (((lVar1 == 0) && (this != (ByteData *)0x0)) && (pEVar8->type == String)) {
      QVar6 = QFlags<QtCbor::Element::ValueFlag>::operator&
                        ((QFlags<QtCbor::Element::ValueFlag> *)
                         CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                         in_stack_fffffffffffffdbc);
      in_stack_fffffffffffffe90 = (QDateTime *)0x0;
      QtPrivate::CompareAgainstLiteralZero::CompareAgainstLiteralZero(&local_51,0);
      bVar5 = operator==(QVar6.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
                         super_QFlagsStorage<QtCbor::Element::ValueFlag>.i);
      if (!bVar5) goto LAB_0046f3b2;
      QVar10 = QtCbor::ByteData::asLatin1((ByteData *)in_stack_fffffffffffffdc8);
      format = QVar10.m_data._4_4_;
      QVar10.m_data._0_7_ = in_stack_fffffffffffffdf8;
      QVar10.m_size = in_stack_fffffffffffffdf0;
      QVar10.m_data._7_1_ = in_stack_fffffffffffffdff;
      QString::QString(in_stack_fffffffffffffdd0,QVar10);
      QDateTime::fromString
                (in_stack_fffffffffffffdd8,(DateFormat)((ulong)in_stack_fffffffffffffdd0 >> 0x20));
      QVar12.i = (Int)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
      QDateTime::operator=
                ((QDateTime *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                 (QDateTime *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      QDateTime::~QDateTime((QDateTime *)0x46f359);
      QString::~QString((QString *)0x46f366);
    }
    else {
LAB_0046f3b2:
      QVar12.i = (Int)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
      if (lVar1 == 1) {
        local_80[0] = &DAT_aaaaaaaaaaaaaaaa;
        local_18d = false;
        if (pEVar8->type == Integer) {
          eVar4 = qMulOverflow<long_long>((pEVar8->field_0).value,1000,(longlong *)local_80);
          local_18d = (enable_if_t<std::is_integral_v<long_long>,_bool>)((eVar4 ^ 0xffU) & 1);
        }
        else if (pEVar8->type == Double) {
          dVar2 = QtCbor::Element::fpvalue
                            ((Element *)
                             CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
          dVar2 = round(dVar2 * 1000.0);
          local_18d = anon_unknown.dwarf_8c5bfa::convertDoubleTo<long_long>
                                (dVar2,(longlong *)local_80,true);
        }
        if (local_18d != false) {
          QTimeZone::QTimeZone
                    ((QTimeZone *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                     in_stack_fffffffffffffdbc);
          QDateTime::fromMSecsSinceEpoch
                    ((qint64)in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
          QDateTime::operator=
                    ((QDateTime *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                     (QDateTime *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
          QDateTime::~QDateTime((QDateTime *)0x46f500);
          QTimeZone::~QTimeZone((QTimeZone *)0x46f50d);
        }
      }
    }
    bVar5 = QDateTime::isValid((QDateTime *)
                               CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
    if (bVar5) {
      local_a8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_a8.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
      local_a8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QDateTime::toString(in_stack_fffffffffffffe90,format);
      QString::toLatin1((QString *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      QString::~QString((QString *)0x46f5be);
      bVar5 = QByteArray::isEmpty((QByteArray *)0x46f5cb);
      if (!bVar5) {
        pQVar13 = &local_a8;
        QByteArray::operator_cast_to_char_((QByteArray *)0x46f5e5);
        QByteArray::size(pQVar13);
        QFlags<QtCbor::Element::ValueFlag>::QFlags
                  ((QFlags<QtCbor::Element::ValueFlag> *)
                   CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                   in_stack_fffffffffffffdbc);
        convertToExtendedType::anon_class_16_2_94731e6a::operator()
                  (in_stack_fffffffffffffdc8,
                   (char *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                   CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                   (ValueFlags)QVar12.i);
        pEVar8->type = String;
        pEVar8 = QList<QtCbor::Element>::operator[]
                           ((QList<QtCbor::Element> *)
                            CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                            CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
        (pEVar8->field_0).value = 0;
        local_140 = DateTime;
      }
      cVar3 = !bVar5;
      QByteArray::~QByteArray((QByteArray *)0x46f6e0);
      if (!(bool)cVar3) goto LAB_0046f6ef;
    }
    else {
LAB_0046f6ef:
      cVar3 = '\x02';
    }
    QDateTime::~QDateTime((QDateTime *)0x46f707);
    if (cVar3 == '\x01') goto LAB_0046fad3;
    break;
  case 0x20:
    if (pEVar8->type == String) {
      if (this != (ByteData *)0x0) {
        local_ec.super_QFlagsStorage<QtCbor::Element::ValueFlag>.i =
             (QFlagsStorage<QtCbor::Element::ValueFlag>)
             QFlags<QtCbor::Element::ValueFlag>::operator&
                       ((QFlags<QtCbor::Element::ValueFlag> *)
                        CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                        in_stack_fffffffffffffdbc);
        QVar12.i = (Int)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
        bVar5 = QFlags::operator_cast_to_bool((QFlags *)&local_ec);
        if (bVar5) {
          QtCbor::ByteData::asQStringRaw((ByteData *)in_stack_fffffffffffffdc8);
        }
        else {
          QtCbor::ByteData::toUtf8String((ByteData *)in_stack_fffffffffffffdc8);
        }
        QUrl::QUrl((QUrl *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                   (QString *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                   TolerantMode);
        QString::~QString((QString *)0x46f7e5);
        bVar5 = QUrl::isValid((QUrl *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8))
        ;
        if (bVar5) {
          local_108.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_108.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
          local_108.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::QUrlTwoFlags
                    (local_124,DecodeReserved);
          QUrl::toString((QUrl *)in_stack_fffffffffffffe90,in_stack_ffffffffffffff2c);
          QString::toUtf8((QString *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
          QString::~QString((QString *)0x46f87c);
          pQVar13 = &local_108;
          QByteArray::operator_cast_to_char_((QByteArray *)0x46f88e);
          QByteArray::size(pQVar13);
          local_128 = 0;
          QFlags<QtCbor::Element::ValueFlag>::QFlags((QFlags<QtCbor::Element::ValueFlag> *)0x46f8ba)
          ;
          convertToExtendedType::anon_class_16_2_94731e6a::operator()
                    (in_stack_fffffffffffffdc8,
                     (char *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                     CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                     (ValueFlags)QVar12.i);
          QByteArray::~QByteArray((QByteArray *)0x46f8e7);
        }
        QUrl::~QUrl((QUrl *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
      }
      local_140 = Url;
      goto LAB_0046fad3;
    }
    break;
  case 0x23:
    if (pEVar8->type == String) {
      local_140 = RegularExpression;
      goto LAB_0046fad3;
    }
    break;
  case 0x25:
    if (pEVar8->type == ByteArray) {
      memset(&local_18,0,0x10);
      QVar12.i = (Int)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
      if (this != (ByteData *)0x0) {
        paVar11 = &local_18;
        __src = QtCbor::ByteData::byte(this);
        local_138[1] = 0x10;
        local_138[0] = this->len;
        puVar9 = qMin<unsigned_long>(local_138 + 1,local_138);
        memcpy(paVar11,__src,*puVar9);
        QVar12.i = (Int)((ulong)__src >> 0x20);
      }
      paVar11 = &local_18;
      memset(local_13c,0,4);
      QFlags<QtCbor::Element::ValueFlag>::QFlags((QFlags<QtCbor::Element::ValueFlag> *)0x46fa9b);
      convertToExtendedType::anon_class_16_2_94731e6a::operator()
                (paVar11,(char *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                 CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),(ValueFlags)QVar12.i)
      ;
      local_140 = Uuid;
      goto LAB_0046fad3;
    }
  }
  local_140 = Tag;
LAB_0046fad3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_140;
  }
  __stack_chk_fail();
}

Assistant:

static QCborValue::Type convertToExtendedType(QCborContainerPrivate *d)
{
    qint64 tag = d->elements.at(0).value;
    auto &e = d->elements[1];
    const ByteData *b = d->byteData(e);

    auto replaceByteData = [&](const char *buf, qsizetype len, Element::ValueFlags f) {
        d->data.clear();
        d->usedData = 0;
        e.flags = Element::HasByteData | f;
        e.value = d->addByteData(buf, len);
    };

    switch (tag) {
#if QT_CONFIG(datestring)
    case qint64(QCborKnownTags::DateTimeString):
    case qint64(QCborKnownTags::UnixTime_t): {
        QDateTime dt;
        if (tag == qint64(QCborKnownTags::DateTimeString) && b &&
            e.type == QCborValue::String && (e.flags & Element::StringIsUtf16) == 0) {
            // The data is supposed to be US-ASCII. If it isn't (contains UTF-8),
            // QDateTime::fromString will fail anyway.
            dt = QDateTime::fromString(b->asLatin1(), Qt::ISODateWithMs);
        } else if (tag == qint64(QCborKnownTags::UnixTime_t)) {
            qint64 msecs;
            bool ok = false;
            if (e.type == QCborValue::Integer) {
#if QT_POINTER_SIZE == 8
                // we don't have a fast 64-bit qMulOverflow implementation on
                // 32-bit architectures.
                ok = !qMulOverflow(e.value, qint64(1000), &msecs);
#else
                static const qint64 Limit = std::numeric_limits<qint64>::max() / 1000;
                ok = (e.value > -Limit && e.value < Limit);
                if (ok)
                    msecs = e.value * 1000;
#endif
            } else if (e.type == QCborValue::Double) {
                ok = convertDoubleTo(round(e.fpvalue() * 1000), &msecs);
            }
            if (ok)
                dt = QDateTime::fromMSecsSinceEpoch(msecs, QTimeZone::UTC);
        }
        if (dt.isValid()) {
            QByteArray text = dt.toString(Qt::ISODateWithMs).toLatin1();
            if (!text.isEmpty()) {
                replaceByteData(text, text.size(), Element::StringIsAscii);
                e.type = QCborValue::String;
                d->elements[0].value = qint64(QCborKnownTags::DateTimeString);
                return QCborValue::DateTime;
            }
        }
        break;
    }
#endif

#ifndef QT_BOOTSTRAPPED
    case qint64(QCborKnownTags::Url):
        if (e.type == QCborValue::String) {
            if (b) {
                // normalize to a short (decoded) form, so as to save space
                QUrl url(e.flags & Element::StringIsUtf16 ?
                             b->asQStringRaw() :
                             b->toUtf8String(), QUrl::StrictMode);
                if (url.isValid()) {
                    QByteArray encoded = url.toString(QUrl::DecodeReserved).toUtf8();
                    replaceByteData(encoded, encoded.size(), {});
                }
            }
            return QCborValue::Url;
        }
        break;
#endif // QT_BOOTSTRAPPED

#if QT_CONFIG(regularexpression)
    case quint64(QCborKnownTags::RegularExpression):
        if (e.type == QCborValue::String) {
            // no normalization is necessary
            return QCborValue::RegularExpression;
        }
        break;
#endif // QT_CONFIG(regularexpression)

    case qint64(QCborKnownTags::Uuid):
        if (e.type == QCborValue::ByteArray) {
            // force the size to 16
            char buf[sizeof(QUuid)] = {};
            if (b)
                memcpy(buf, b->byte(), qMin(sizeof(buf), size_t(b->len)));
            replaceByteData(buf, sizeof(buf), {});

            return QCborValue::Uuid;
        }
        break;
    }

    // no enriching happened
    return QCborValue::Tag;
}